

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

addrinfo * Jupiter::Socket::getAddrInfo(addrinfo *addr,uint result)

{
  addrinfo *local_20;
  addrinfo *ptr;
  uint result_local;
  addrinfo *addr_local;
  
  ptr._4_4_ = result;
  for (local_20 = addr; local_20 != (addrinfo *)0x0 && ptr._4_4_ != 0; local_20 = local_20->ai_next)
  {
    ptr._4_4_ = ptr._4_4_ - 1;
  }
  return local_20;
}

Assistant:

addrinfo *Jupiter::Socket::getAddrInfo(addrinfo *addr, unsigned int result) { // static
	addrinfo* ptr = addr;
	while (ptr != nullptr && result != 0) {
		ptr = ptr->ai_next;
		--result;
	}

	return ptr;
}